

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssutil.cpp
# Opt level: O2

QPen qPenFromStyle(QBrush *b,qreal width,BorderStyle s)

{
  undefined4 in_EDX;
  PenStyle s_00;
  undefined4 in_register_00000034;
  
  s_00 = NoPen;
  switch(in_EDX) {
  case 2:
    s_00 = DotLine;
    break;
  case 3:
    s_00 = (width == 1.0) + DashLine;
    break;
  case 4:
  case 10:
  case 0xb:
    s_00 = SolidLine;
    break;
  case 6:
    s_00 = DashDotLine;
    break;
  case 7:
    s_00 = DashDotDotLine;
  }
  QPen::QPen((QPen *)b,(QBrush *)CONCAT44(in_register_00000034,s),width,s_00,FlatCap,BevelJoin);
  return (DataPtr)(DataPtr)b;
}

Assistant:

static QPen qPenFromStyle(const QBrush& b, qreal width, BorderStyle s)
{
    Qt::PenStyle ps = Qt::NoPen;

    switch (s) {
    case BorderStyle_Dotted:
        ps  = Qt::DotLine;
        break;
    case BorderStyle_Dashed:
        ps = width == 1 ? Qt::DotLine : Qt::DashLine;
        break;
    case BorderStyle_DotDash:
        ps = Qt::DashDotLine;
        break;
    case BorderStyle_DotDotDash:
        ps = Qt::DashDotDotLine;
        break;
    case BorderStyle_Inset:
    case BorderStyle_Outset:
    case BorderStyle_Solid:
        ps = Qt::SolidLine;
        break;
    default:
        break;
    }

    return QPen(b, width, ps, Qt::FlatCap);
}